

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPMacAlgorithm.cpp
# Opt level: O3

bool __thiscall
OSSLEVPMacAlgorithm::verifyUpdate(OSSLEVPMacAlgorithm *this,ByteString *originalData)

{
  HMAC_CTX *ctx;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  uchar *data;
  ByteString dummy;
  ByteString local_50;
  
  bVar1 = MacAlgorithm::verifyUpdate(&this->super_MacAlgorithm,originalData);
  if (bVar1) {
    sVar3 = ByteString::size(originalData);
    if (sVar3 == 0) {
      return true;
    }
    ctx = (HMAC_CTX *)this->curCTX;
    data = ByteString::const_byte_str(originalData);
    sVar3 = ByteString::size(originalData);
    iVar2 = HMAC_Update(ctx,data,sVar3);
    if (iVar2 != 0) {
      return true;
    }
    softHSMLog(3,"verifyUpdate",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPMacAlgorithm.cpp"
               ,0xb5,"HMAC_Update failed");
    HMAC_CTX_free(this->curCTX);
    this->curCTX = (HMAC_CTX *)0x0;
    ByteString::ByteString(&local_50);
    MacAlgorithm::verifyFinal(&this->super_MacAlgorithm,&local_50);
    local_50._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_50.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  }
  return false;
}

Assistant:

bool OSSLEVPMacAlgorithm::verifyUpdate(const ByteString& originalData)
{
	if (!MacAlgorithm::verifyUpdate(originalData))
	{
		return false;
	}

	// The GOST implementation in OpenSSL will segfault if we update with zero length.
	if (originalData.size() == 0) return true;

	if (!HMAC_Update(curCTX, originalData.const_byte_str(), originalData.size()))
	{
		ERROR_MSG("HMAC_Update failed");

		HMAC_CTX_free(curCTX);
		curCTX = NULL;

		ByteString dummy;
		MacAlgorithm::verifyFinal(dummy);

		return false;
	}

	return true;
}